

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  long *plVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  long *plVar8;
  void **ppvVar9;
  int *piVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *puVar15;
  long *plVar16;
  void **ppvVar17;
  
  iVar6 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    if (loop->inotify_fd == -1) {
      iVar6 = inotify_init1(0x80800);
      if (iVar6 < 0) {
        piVar10 = __errno_location();
        if (*piVar10 != 0) {
          return -*piVar10;
        }
      }
      else {
        loop->inotify_fd = iVar6;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar6);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
      }
    }
    iVar6 = inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
    if (iVar6 == -1) {
      piVar10 = __errno_location();
      iVar6 = -*piVar10;
    }
    else {
      for (plVar8 = (long *)handle->loop->inotify_watchers; plVar8 != (long *)0x0;
          plVar8 = (long *)*plVar8) {
        if ((int)plVar8[8] <= iVar6) {
          if (iVar6 <= (int)plVar8[8]) goto LAB_00247236;
          plVar8 = plVar8 + 1;
        }
      }
      sVar7 = strlen(path);
      plVar8 = (long *)uv__malloc(sVar7 + 0x49);
      if (plVar8 == (long *)0x0) {
        iVar6 = -0xc;
      }
      else {
        *(int *)(plVar8 + 8) = iVar6;
        memcpy(plVar8 + 9,path,sVar7 + 1);
        plVar8[7] = (long)(plVar8 + 9);
        plVar8[4] = (long)(plVar8 + 4);
        plVar8[5] = (long)(plVar8 + 4);
        *(undefined4 *)(plVar8 + 6) = 0;
        plVar11 = (long *)handle->loop->inotify_watchers;
        ppvVar9 = &handle->loop->inotify_watchers;
        if (plVar11 == (long *)0x0) {
          *plVar8 = 0;
          plVar8[1] = 0;
          plVar8[2] = 0;
          *(undefined4 *)(plVar8 + 3) = 1;
          *ppvVar9 = plVar8;
          plVar11 = plVar8;
        }
        else {
          do {
            plVar12 = plVar11;
            iVar2 = (int)plVar12[8];
            plVar14 = plVar12;
            if (iVar2 <= iVar6) {
              if (iVar6 <= iVar2) goto LAB_00247236;
              plVar14 = plVar12 + 1;
            }
            plVar11 = (long *)*plVar14;
          } while ((long *)*plVar14 != (long *)0x0);
          plVar8[2] = (long)plVar12;
          *plVar8 = 0;
          plVar8[1] = 0;
          *(undefined4 *)(plVar8 + 3) = 1;
          plVar12[iVar2 <= iVar6] = (long)plVar8;
          plVar11 = plVar8;
          do {
            if ((int)plVar12[3] != 1) break;
            plVar14 = (long *)plVar12[2];
            plVar16 = (long *)*plVar14;
            plVar13 = plVar11;
            if (plVar12 == plVar16) {
              lVar5 = plVar14[1];
              if ((lVar5 != 0) && (*(int *)(lVar5 + 0x18) == 1)) {
                *(undefined4 *)(lVar5 + 0x18) = 0;
                goto LAB_0024707b;
              }
              plVar4 = (long *)plVar12[1];
              if (plVar4 == plVar11) {
                lVar5 = *plVar4;
                plVar12[1] = lVar5;
                if (lVar5 == 0) {
                  plVar4[2] = (long)plVar14;
                  puVar15 = (undefined8 *)plVar12[2];
LAB_00247165:
                  ppvVar17 = (void **)(puVar15 + (plVar12 != (long *)*puVar15));
                }
                else {
                  *(long **)(lVar5 + 0x10) = plVar12;
                  puVar15 = (undefined8 *)plVar12[2];
                  plVar4[2] = (long)puVar15;
                  ppvVar17 = ppvVar9;
                  if (puVar15 != (undefined8 *)0x0) goto LAB_00247165;
                }
                *ppvVar17 = plVar4;
                *plVar4 = (long)plVar12;
                plVar12[2] = (long)plVar4;
                plVar16 = (long *)*plVar14;
                plVar13 = plVar12;
                plVar12 = plVar11;
              }
              *(undefined4 *)(plVar12 + 3) = 0;
              *(undefined4 *)(plVar14 + 3) = 1;
              lVar5 = plVar16[1];
              *plVar14 = lVar5;
              if (lVar5 != 0) {
                *(long **)(lVar5 + 0x10) = plVar14;
              }
              puVar15 = (undefined8 *)plVar14[2];
              plVar16[2] = (long)puVar15;
              ppvVar17 = ppvVar9;
              if (puVar15 != (undefined8 *)0x0) {
                ppvVar17 = (void **)(puVar15 + (plVar14 != (long *)*puVar15));
              }
              *ppvVar17 = plVar16;
              plVar16[1] = (long)plVar14;
              plVar14[2] = (long)plVar16;
            }
            else if ((plVar16 == (long *)0x0) || ((int)plVar16[3] != 1)) {
              plVar16 = (long *)*plVar12;
              if (plVar16 == plVar11) {
                lVar5 = plVar16[1];
                *plVar12 = lVar5;
                if (lVar5 == 0) {
                  plVar16[2] = (long)plVar14;
                  puVar15 = (undefined8 *)plVar12[2];
LAB_002470f4:
                  ppvVar17 = (void **)(puVar15 + (plVar12 != (long *)*puVar15));
                }
                else {
                  *(long **)(lVar5 + 0x10) = plVar12;
                  puVar15 = (undefined8 *)plVar12[2];
                  plVar16[2] = (long)puVar15;
                  ppvVar17 = ppvVar9;
                  if (puVar15 != (undefined8 *)0x0) goto LAB_002470f4;
                }
                *ppvVar17 = plVar16;
                plVar16[1] = (long)plVar12;
                plVar12[2] = (long)plVar16;
                plVar13 = plVar12;
                plVar12 = plVar11;
              }
              *(undefined4 *)(plVar12 + 3) = 0;
              *(undefined4 *)(plVar14 + 3) = 1;
              plVar11 = (long *)plVar14[1];
              lVar5 = *plVar11;
              plVar14[1] = lVar5;
              if (lVar5 != 0) {
                *(long **)(lVar5 + 0x10) = plVar14;
              }
              puVar15 = (undefined8 *)plVar14[2];
              plVar11[2] = (long)puVar15;
              ppvVar17 = ppvVar9;
              if (puVar15 != (undefined8 *)0x0) {
                ppvVar17 = (void **)(puVar15 + (plVar14 != (long *)*puVar15));
              }
              *ppvVar17 = plVar11;
              *plVar11 = (long)plVar14;
              plVar14[2] = (long)plVar11;
            }
            else {
              *(undefined4 *)(plVar16 + 3) = 0;
LAB_0024707b:
              *(undefined4 *)(plVar12 + 3) = 0;
              *(undefined4 *)(plVar14 + 3) = 1;
              plVar13 = plVar14;
            }
            plVar12 = (long *)plVar13[2];
            plVar11 = plVar13;
          } while (plVar12 != (long *)0x0);
          plVar11 = (long *)*ppvVar9;
        }
        *(undefined4 *)(plVar11 + 3) = 0;
LAB_00247236:
        uVar3 = handle->flags;
        if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->watchers[0] = plVar8 + 4;
        plVar11 = (long *)plVar8[5];
        handle->watchers[1] = plVar11;
        *plVar11 = (long)handle->watchers;
        plVar8[5] = (long)handle->watchers;
        handle->path = (char *)plVar8[7];
        handle->cb = cb;
        handle->wd = iVar6;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}